

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O0

void registration_func(worker_handle *wh)

{
  REGISTRATION_STATUS status_00;
  registration_service_handle *rs_00;
  void *pvVar1;
  size_t slots_total_00;
  size_t slots_used_00;
  REGISTRATION_STATUS status;
  size_t slots_used;
  size_t slots_total;
  int ret;
  registration_service_priv *priv;
  registration_service_handle *rs;
  worker_handle *wh_local;
  
  rs_00 = (registration_service_handle *)wh->func_ctx;
  pvVar1 = rs_00->priv;
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x20));
  slots_total_00 = *(size_t *)((long)pvVar1 + 0x48);
  slots_used_00 = *(size_t *)((long)pvVar1 + 0x50);
  status_00 = *(REGISTRATION_STATUS *)((long)pvVar1 + 0x58);
  mutex_unlock((mutex_handle *)((long)pvVar1 + 0x20));
  if (status_00 != REGISTRATION_STATUS_UNKNOWN) {
    send_report(rs_00,status_00,slots_used_00,slots_total_00);
  }
  return;
}

Assistant:

static void registration_func(struct worker_handle *wh)
{
	struct registration_service_handle *rs = wh->func_ctx;
	struct registration_service_priv *priv = rs->priv;

	int ret;
	size_t slots_total;
	size_t slots_used;
	enum REGISTRATION_STATUS status;

	mutex_lock(&priv->mutex);

	slots_total = priv->slots_total;
	slots_used = priv->slots_used;
	status = priv->status;

	mutex_unlock(&priv->mutex);

	if (status <= REGISTRATION_STATUS_UNKNOWN)
		return;

	ret = send_report(rs, status, slots_used, slots_total);
	if (ret < 0) {
		/* printf("Proxy registration failed (%d): %s\n",
		 *	  -ret, strerror(-ret));
		 */
	}
}